

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_Function_Test::Body
          (iu_PeepClassTest_x_iutest_x_Function_Test *this)

{
  int *in_R9;
  iuCodeMessage local_200;
  AssertionResult iutest_ar;
  type peep_get;
  type peep_set;
  Fixed local_198;
  
  peep_set.m_ptr = (ProdClass *)s_prod;
  iutest::detail::peep::
  Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_SetX<test::prod_test::ProdClass>>::
  peep_member_function_impl<test::prod_test::ProdClass,void(test::prod_test::ProdClass::*)(int)>::
  operator()((peep_member_function_impl<test::prod_test::ProdClass,void(test::prod_test::ProdClass::*)(int)>
              *)&peep_set,0x65);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x65;
  local_200.m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"101","s_prod.GetX()",(char *)&local_198,(int *)&local_200,in_R9
            );
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x110,iutest_ar.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_198);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  peep_get.m_ptr = (ProdClass *)s_prod;
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x65;
  local_200.m_message._M_dataplus._M_p._0_4_ =
       iutest::detail::peep::
       Peep<test::prod_test::ProdClass,_test::prod_test::iu_peep_tag_ConstGetX<test::prod_test::ProdClass>_>
       ::
       peep_member_function_impl<test::prod_test::ProdClass,_int_(test::prod_test::ProdClass::*)()_const>
       ::operator()<>(&peep_get);
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"101","peep_get()",(char *)&local_198,(int *)&local_200,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x113,iutest_ar.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_198);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(PeepClassTest, PeepObject2)
{
    IUTEST_PEEP(ProdClass2, m_x) prod_class2_x(&s_prod2);
    prod_class2_x = 54;
    IUTEST_EXPECT_EQ(54, s_prod2.GetX());
    prod_class2_x += prod_class2_x;
    IUTEST_EXPECT_EQ(108, s_prod2.GetX());

    IUTEST_EXPECT_EQ(108, prod_class2_x);
}